

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void __thiscall SFFile::LoadSample(SFFile *this,SFSample *sample)

{
  undefined1 auVar1 [16];
  char *name;
  ulong uVar2;
  _func_int **pp_Var3;
  byte local_27;
  short local_26;
  uint local_24;
  BYTE samp_1;
  SWORD samp;
  FileReader *pFStack_20;
  DWORD i;
  FileReader *fp;
  SFSample *sample_local;
  SFFile *this_local;
  
  fp = (FileReader *)sample;
  sample_local = (SFSample *)this;
  name = FString::operator_cast_to_char_(&(this->super_FontFile).Filename);
  pFStack_20 = PathExpander::openFileReader((PathExpander *)Timidity::pathExpander,name,(int *)0x0);
  if (pFStack_20 != (FileReader *)0x0) {
    auVar1 = ZEXT416((*(int *)((long)&fp->File + 4) - *(int *)&fp->File) + 1) * ZEXT816(4);
    uVar2 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pp_Var3 = (_func_int **)operator_new__(uVar2);
    (fp->super_FileReaderBase)._vptr_FileReaderBase = pp_Var3;
    (*(pFStack_20->super_FileReaderBase)._vptr_FileReaderBase[4])
              (pFStack_20,(ulong)(this->SampleDataOffset + *(int *)&fp->File * 2),0);
    for (local_24 = 0; local_24 < (uint)(*(int *)((long)&fp->File + 4) - *(int *)&fp->File);
        local_24 = local_24 + 1) {
      FileReader::operator>>(pFStack_20,&local_26);
      *(float *)((long)(fp->super_FileReaderBase)._vptr_FileReaderBase + (ulong)local_24 * 4) =
           (float)(int)local_26 / 32768.0;
    }
    if (this->SampleDataLSBOffset != 0) {
      (*(pFStack_20->super_FileReaderBase)._vptr_FileReaderBase[4])
                (pFStack_20,(ulong)(this->SampleDataLSBOffset + *(int *)&fp->File),0);
      for (local_24 = 0; local_24 < (uint)(*(int *)((long)&fp->File + 4) - *(int *)&fp->File);
          local_24 = local_24 + 1) {
        FileReader::operator>>(pFStack_20,&local_27);
        *(float *)((long)(fp->super_FileReaderBase)._vptr_FileReaderBase + (ulong)local_24 * 4) =
             (float)((int)(((int)(*(float *)((long)(fp->super_FileReaderBase)._vptr_FileReaderBase +
                                            (ulong)local_24 * 4) * 32768.0) << 8 | (uint)local_27)
                          << 8) >> 8) / 8388608.0;
      }
    }
    *(undefined4 *)((long)(fp->super_FileReaderBase)._vptr_FileReaderBase + (ulong)local_24 * 4) = 0
    ;
    if (pFStack_20 != (FileReader *)0x0) {
      (*(pFStack_20->super_FileReaderBase)._vptr_FileReaderBase[1])();
    }
  }
  return;
}

Assistant:

void SFFile::LoadSample(SFSample *sample)
{
	FileReader *fp = pathExpander.openFileReader(Filename, NULL);
	DWORD i;

	if (fp == NULL)
	{
		return;
	}
	sample->InMemoryData = new float[sample->End - sample->Start + 1];
	fp->Seek(SampleDataOffset + sample->Start * 2, SEEK_SET);
	// Load 16-bit sample data.
	for (i = 0; i < sample->End - sample->Start; ++i)
	{
		SWORD samp;
		*fp >> samp;
		sample->InMemoryData[i] = samp / 32768.f;
	}
	if (SampleDataLSBOffset != 0)
	{ // Load lower 8 bits of 24-bit sample data.
		fp->Seek(SampleDataLSBOffset + sample->Start, SEEK_SET);
		for (i = 0; i < sample->End - sample->Start; ++i)
		{
			BYTE samp;
			*fp >> samp;
			sample->InMemoryData[i] = ((((SDWORD(sample->InMemoryData[i] * 32768) << 8) | samp) << 8) >> 8) / 8388608.f;
		}
	}
	// Final 0 byte is for interpolation.
	sample->InMemoryData[i] = 0;
	delete fp;
}